

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O0

void __thiscall
avro::
NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::NoAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
::NodeImpl(NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::NoAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
           *this,Type type,SingleAttribute<avro::Name> *name,
          NoAttribute<boost::shared_ptr<avro::Node>_> *leaves,
          NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *leafNames,NoAttribute<int> *size)

{
  Type in_ESI;
  Node *in_RDI;
  SingleAttribute<avro::Name> *in_stack_ffffffffffffffc0;
  
  Node::Node(in_RDI,in_ESI);
  in_RDI->_vptr_Node = (_func_int **)&PTR__NodeImpl_00233e30;
  concepts::SingleAttribute<avro::Name>::SingleAttribute
            (in_stack_ffffffffffffffc0,(SingleAttribute<avro::Name> *)in_RDI);
  return;
}

Assistant:

NodeImpl(Type type, 
             const NameConcept &name, 
             const LeavesConcept &leaves, 
             const LeafNamesConcept &leafNames,
             const SizeConcept &size) :
        Node(type),
        nameAttribute_(name),
        leafAttributes_(leaves),
        leafNameAttributes_(leafNames),
        sizeAttribute_(size)
    { }